

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
P8Lice::getSensors_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,P8Lice *this,time_t start,time_t stop)

{
  size_type sVar1;
  reference __x;
  ulong local_50;
  size_t i;
  undefined1 local_40 [8];
  vector<SensorReading,_std::allocator<SensorReading>_> allsens;
  time_t stop_local;
  time_t start_local;
  P8Lice *this_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  allsens.super__Vector_base<SensorReading,_std::allocator<SensorReading>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)stop;
  getReadings((vector<SensorReading,_std::allocator<SensorReading>_> *)local_40,this,start,stop);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  for (local_50 = 0;
      sVar1 = std::vector<SensorReading,_std::allocator<SensorReading>_>::size
                        ((vector<SensorReading,_std::allocator<SensorReading>_> *)local_40),
      local_50 < sVar1; local_50 = local_50 + 1) {
    __x = std::vector<SensorReading,_std::allocator<SensorReading>_>::operator[]
                    ((vector<SensorReading,_std::allocator<SensorReading>_> *)local_40,local_50);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,&__x->sensor_name);
  }
  std::vector<SensorReading,_std::allocator<SensorReading>_>::~vector
            ((vector<SensorReading,_std::allocator<SensorReading>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

set<string> P8Lice::getSensors(time_t start,time_t stop) {
	vector<SensorReading> allsens=getReadings(start,stop);
	set<string> ret;
	for(size_t i=0;i<allsens.size();i++)
		ret.insert(allsens[i].sensor_name);
	return ret;
}